

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMemory.c
# Opt level: O2

Extra_MmStep_t * Extra_MmStepStart(int nSteps)

{
  int iVar1;
  Extra_MmStep_t *pEVar2;
  Extra_MmFixed_t **ppEVar3;
  Extra_MmFixed_t *pEVar4;
  Extra_MmFixed_t **ppEVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  pEVar2 = (Extra_MmStep_t *)calloc(1,0x30);
  pEVar2->nMems = nSteps;
  ppEVar3 = (Extra_MmFixed_t **)malloc((long)nSteps * 8);
  pEVar2->pMems = ppEVar3;
  uVar8 = 0;
  uVar7 = 0;
  if (0 < nSteps) {
    uVar7 = (ulong)(uint)nSteps;
  }
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    pEVar4 = Extra_MmFixedStart(8 << ((byte)uVar8 & 0x1f));
    ppEVar3[uVar8] = pEVar4;
  }
  iVar1 = 4 << ((byte)nSteps & 0x1f);
  pEVar2->nMapSize = iVar1;
  ppEVar5 = (Extra_MmFixed_t **)malloc((long)(iVar1 + 1) << 3);
  *ppEVar5 = (Extra_MmFixed_t *)0x0;
  pEVar2->pMap = ppEVar5;
  pEVar4 = *ppEVar3;
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    ppEVar5[lVar6 + 1] = pEVar4;
  }
  for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    for (lVar6 = (long)((4 << ((byte)uVar8 & 0x1f)) + 1); lVar6 <= 8 << ((byte)uVar8 & 0x1f);
        lVar6 = lVar6 + 1) {
      ppEVar5[lVar6] = ppEVar3[uVar8];
    }
  }
  return pEVar2;
}

Assistant:

Extra_MmStep_t * Extra_MmStepStart( int nSteps )
{
    Extra_MmStep_t * p;
    int i, k;
    p = ABC_ALLOC( Extra_MmStep_t, 1 );
    memset( p, 0, sizeof(Extra_MmStep_t) );
    p->nMems = nSteps;
    // start the fixed memory managers
    p->pMems = ABC_ALLOC( Extra_MmFixed_t *, p->nMems );
    for ( i = 0; i < p->nMems; i++ )
        p->pMems[i] = Extra_MmFixedStart( (8<<i) );
    // set up the mapping of the required memory size into the corresponding manager
    p->nMapSize = (4<<p->nMems);
    p->pMap = ABC_ALLOC( Extra_MmFixed_t *, p->nMapSize+1 );
    p->pMap[0] = NULL;
    for ( k = 1; k <= 4; k++ )
        p->pMap[k] = p->pMems[0];
    for ( i = 0; i < p->nMems; i++ )
        for ( k = (4<<i)+1; k <= (8<<i); k++ )
            p->pMap[k] = p->pMems[i];
//for ( i = 1; i < 100; i ++ )
//printf( "%10d: size = %10d\n", i, p->pMap[i]->nEntrySize );
    return p;
}